

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.h
# Opt level: O3

node_type * __thiscall
eastl::
hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
::DoAllocateNode(hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
                 *this,value_type *value)

{
  value_type *pvVar1;
  node_type *pnVar2;
  value_type *pvVar3;
  uint uVar4;
  value_type *__dest;
  size_t sVar5;
  value_type *pvVar6;
  value_type *__dest_00;
  
  pnVar2 = (node_type *)malloc(0x48);
  pvVar1 = (value->first).mpBegin;
  sVar5 = (long)(value->first).mpEnd - (long)pvVar1;
  uVar4 = (int)sVar5 + 1;
  __dest_00 = &gEmptyString;
  pvVar6 = &DAT_001060c5;
  __dest = &gEmptyString;
  pvVar3 = pvVar6;
  if (1 < uVar4) {
    __dest = (value_type *)malloc((ulong)uVar4);
    pvVar3 = __dest + uVar4;
  }
  (pnVar2->mValue).first.mpBegin = __dest;
  (pnVar2->mValue).first.mpCapacity = pvVar3;
  memmove(__dest,pvVar1,sVar5);
  (pnVar2->mValue).first.mpEnd = __dest + sVar5;
  __dest[sVar5] = '\0';
  pvVar1 = (value->second).mpBegin;
  sVar5 = (long)(value->second).mpEnd - (long)pvVar1;
  uVar4 = (int)sVar5 + 1;
  if (1 < uVar4) {
    __dest_00 = (value_type *)malloc((ulong)uVar4);
    pvVar6 = __dest_00 + uVar4;
  }
  (pnVar2->mValue).second.mpBegin = __dest_00;
  (pnVar2->mValue).second.mpCapacity = pvVar6;
  memmove(__dest_00,pvVar1,sVar5);
  (pnVar2->mValue).second.mpEnd = __dest_00 + sVar5;
  __dest_00[sVar5] = '\0';
  pnVar2->mpNext =
       (hash_node<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false>
        *)0x0;
  return pnVar2;
}

Assistant:

typename hashtable<K, V, A, EK, Eq, H1, H2, H, RP, bC, bM, bU>::node_type*
    hashtable<K, V, A, EK, Eq, H1, H2, H, RP, bC, bM, bU>::DoAllocateNode(const value_type& value)
    {
        node_type* const pNode = (node_type*)allocate_memory(mAllocator, sizeof(node_type), kValueAlignment, kValueAlignmentOffset);

        #if EASTL_EXCEPTIONS_ENABLED
            try
            {
        #endif
                ::new(&pNode->mValue) value_type(value);
                pNode->mpNext = NULL;
                return pNode;
        #if EASTL_EXCEPTIONS_ENABLED
            }
            catch(...)
            {
                EASTLFree(mAllocator, pNode, sizeof(node_type));
                throw;
            }
        #endif
    }